

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparseMatrixEigenExtensions.h
# Opt level: O2

void __thiscall
Eigen::SparseMatrix<double,_1,_int>::setZeroValues(SparseMatrix<double,_1,_int> *this)

{
  int k;
  long outer;
  InnerIterator it;
  InnerIterator local_48;
  
  for (outer = 0; outer < this->m_outerSize; outer = outer + 1) {
    SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::InnerIterator
              (&local_48,&this->super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
               outer);
    for (; local_48.m_id < local_48.m_end; local_48.m_id = local_48.m_id + 1) {
      local_48.m_values[local_48.m_id] = 0.0;
    }
  }
  return;
}

Assistant:

void setZeroValues() {
    for (int k = 0; k < outerSize(); ++k) {
        for (InnerIterator it(*this, k); it; ++it) {
            it.valueRef() = 0.0;
        }
    }
}